

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Diagnostics * __thiscall slang::ast::Compilation::getParseDiagnostics(Compilation *this)

{
  optional<slang::Diagnostics> *this_00;
  pointer psVar1;
  element_type *peVar2;
  Diagnostic *first;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar3;
  
  this_00 = &this->cachedParseDiagnostics;
  if ((this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
      _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_engaged == false) {
    memset(this_00,0,0xf8);
    *(undefined1 **)
     &(this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
      _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
      super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic> =
         (undefined1 *)
         ((long)&(this->cachedParseDiagnostics).
                 super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
                 super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
                 super__Optional_payload_base<slang::Diagnostics>._M_payload + 0x18);
    *(size_type *)
     ((long)&(this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
             _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
             super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
             super_SmallVector<slang::Diagnostic,_2UL> + 8) = 0;
    *(size_type *)
     ((long)&(this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
             _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
             super__Optional_payload_base<slang::Diagnostics>._M_payload._M_value.
             super_SmallVector<slang::Diagnostic,_2UL> + 0x10) = 2;
    (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload
    .super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
    super__Optional_payload_base<slang::Diagnostics>._M_engaged = true;
    psVar1 = (this->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar3 = (this->syntaxTrees).
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1)
    {
      peVar2 = (psVar3->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      first = (peVar2->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.data_;
      SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
                ((SmallVectorBase<slang::Diagnostic> *)this_00,first,
                 first + (peVar2->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                         super_SmallVectorBase<slang::Diagnostic>.len);
    }
    if (this->sourceManager != (SourceManager *)0x0) {
      Diagnostics::sort((Diagnostics *)this_00,this->sourceManager);
    }
  }
  return (Diagnostics *)this_00;
}

Assistant:

const Diagnostics& Compilation::getParseDiagnostics() {
    if (cachedParseDiagnostics)
        return *cachedParseDiagnostics;

    SLANG_ASSERT(!isFrozen());

    cachedParseDiagnostics.emplace();
    for (auto& tree : syntaxTrees)
        cachedParseDiagnostics->append_range(tree->diagnostics());

    if (sourceManager)
        cachedParseDiagnostics->sort(*sourceManager);
    return *cachedParseDiagnostics;
}